

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructureWrite(Fts5Index *p,Fts5Structure *pStruct)

{
  int *pRc;
  uint uVar1;
  uint uVar2;
  u8 *puVar3;
  Fts5StructureLevel *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Fts5Buffer local_58;
  Fts5Index *local_48;
  Fts5StructureLevel *local_40;
  Fts5Structure *local_38;
  
  if (p->rc != 0) {
    return;
  }
  pRc = &p->rc;
  local_58.p = (u8 *)0x0;
  local_58.n = 0;
  local_58.nSpace = 0;
  uVar1 = p->pConfig->iCookie;
  local_48 = p;
  iVar5 = sqlite3Fts5BufferSize(pRc,&local_58,0x1f);
  puVar3 = local_58.p;
  if (iVar5 == 0) {
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    *(uint *)local_58.p =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    iVar5 = sqlite3Fts5PutVarint((uchar *)((long)local_58.p + 4),(long)pStruct->nLevel);
    iVar6 = sqlite3Fts5PutVarint((uchar *)((long)puVar3 + (long)iVar5 + 4),(long)pStruct->nSegment);
    iVar7 = sqlite3Fts5PutVarint
                      ((uchar *)((long)(iVar6 + iVar5 + 4) + (long)puVar3),pStruct->nWriteCounter);
    local_58.n = iVar7 + iVar5 + iVar6 + 4;
  }
  local_40 = pStruct->aLevel;
  local_38 = pStruct;
  for (lVar8 = 0; pFVar4 = local_40, lVar8 < local_38->nLevel; lVar8 = lVar8 + 1) {
    sqlite3Fts5BufferAppendVarint(pRc,&local_58,(long)local_40[lVar8].nMerge);
    sqlite3Fts5BufferAppendVarint(pRc,&local_58,(long)pFVar4[lVar8].nSeg);
    lVar10 = 0;
    for (lVar9 = 0; lVar9 < pFVar4[lVar8].nSeg; lVar9 = lVar9 + 1) {
      sqlite3Fts5BufferAppendVarint
                (pRc,&local_58,(long)*(int *)((long)&(pFVar4[lVar8].aSeg)->iSegid + lVar10));
      sqlite3Fts5BufferAppendVarint
                (pRc,&local_58,(long)*(int *)((long)&(pFVar4[lVar8].aSeg)->pgnoFirst + lVar10));
      sqlite3Fts5BufferAppendVarint
                (pRc,&local_58,(long)*(int *)((long)&(pFVar4[lVar8].aSeg)->pgnoLast + lVar10));
      lVar10 = lVar10 + 0xc;
    }
  }
  fts5DataWrite(local_48,10,local_58.p,local_58.n);
  sqlite3Fts5BufferFree(&local_58);
  return;
}

Assistant:

static void fts5StructureWrite(Fts5Index *p, Fts5Structure *pStruct){
  if( p->rc==SQLITE_OK ){
    Fts5Buffer buf;               /* Buffer to serialize record into */
    int iLvl;                     /* Used to iterate through levels */
    int iCookie;                  /* Cookie value to store */

    assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
    memset(&buf, 0, sizeof(Fts5Buffer));

    /* Append the current configuration cookie */
    iCookie = p->pConfig->iCookie;
    if( iCookie<0 ) iCookie = 0;

    if( 0==sqlite3Fts5BufferSize(&p->rc, &buf, 4+9+9+9) ){
      sqlite3Fts5Put32(buf.p, iCookie);
      buf.n = 4;
      fts5BufferSafeAppendVarint(&buf, pStruct->nLevel);
      fts5BufferSafeAppendVarint(&buf, pStruct->nSegment);
      fts5BufferSafeAppendVarint(&buf, (i64)pStruct->nWriteCounter);
    }

    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      int iSeg;                     /* Used to iterate through segments */
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nMerge);
      fts5BufferAppendVarint(&p->rc, &buf, pLvl->nSeg);
      assert( pLvl->nMerge<=pLvl->nSeg );

      for(iSeg=0; iSeg<pLvl->nSeg; iSeg++){
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].iSegid);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoFirst);
        fts5BufferAppendVarint(&p->rc, &buf, pLvl->aSeg[iSeg].pgnoLast);
      }
    }

    fts5DataWrite(p, FTS5_STRUCTURE_ROWID, buf.p, buf.n);
    fts5BufferFree(&buf);
  }
}